

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *this,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *list)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  void *pvVar4;
  pointer pNVar5;
  pointer pNVar6;
  long lVar7;
  ulong uVar8;
  
  pNVar5 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar6 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = (long)pNVar6 - (long)pNVar5 >> 4;
  if (*(ulong *)(this + 0x10) < uVar8) {
    *(ulong *)(this + 0x10) = uVar8;
    pvVar4 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),(long)pNVar6 - (long)pNVar5,8);
    *(void **)this = pvVar4;
    pNVar5 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar6 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pNVar5 != pNVar6) {
    lVar7 = 0;
    do {
      lVar2 = *(long *)this;
      puVar1 = (undefined8 *)((long)&(pNVar5->super_IString).str._M_len + lVar7);
      uVar3 = puVar1[1];
      *(undefined8 *)(lVar2 + lVar7) = *puVar1;
      ((undefined8 *)(lVar2 + lVar7))[1] = uVar3;
      lVar7 = lVar7 + 0x10;
    } while ((pointer)(puVar1 + 2) != pNVar6);
  }
  *(ulong *)(this + 8) = uVar8;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }